

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

bool AppInitBasicSetup(ArgsManager *args,atomic<int> *exit_status)

{
  bool bVar1;
  long in_FS_OFFSET;
  string in_stack_ffffffffffffff88;
  bilingual_str local_50;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = SetupNetworking();
  if (bVar1) {
    registerSignalHandler(0xf,HandleSIGTERM);
    registerSignalHandler(2,HandleSIGTERM);
    registerSignalHandler(1,HandleSIGHUP);
    signal(0xd,(__sighandler_t)&DAT_00000001);
    std::set_new_handler(new_handler_terminate);
    bVar1 = true;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffff90,"Initializing networking failed.",
               (allocator<char> *)&stack0xffffffffffffff8f);
    Untranslated(&local_50,in_stack_ffffffffffffff88);
    bVar1 = InitError(&local_50);
    bilingual_str::~bilingual_str(&local_50);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool AppInitBasicSetup(const ArgsManager& args, std::atomic<int>& exit_status)
{
    // ********************************************************* Step 1: setup
#ifdef _MSC_VER
    // Turn off Microsoft heap dump noise
    _CrtSetReportMode(_CRT_WARN, _CRTDBG_MODE_FILE);
    _CrtSetReportFile(_CRT_WARN, CreateFileA("NUL", GENERIC_WRITE, 0, nullptr, OPEN_EXISTING, 0, 0));
    // Disable confusing "helpful" text message on abort, Ctrl-C
    _set_abort_behavior(0, _WRITE_ABORT_MSG | _CALL_REPORTFAULT);
#endif
#ifdef WIN32
    // Enable heap terminate-on-corruption
    HeapSetInformation(nullptr, HeapEnableTerminationOnCorruption, nullptr, 0);
#endif
    if (!SetupNetworking()) {
        return InitError(Untranslated("Initializing networking failed."));
    }

#ifndef WIN32
    // Clean shutdown on SIGTERM
    registerSignalHandler(SIGTERM, HandleSIGTERM);
    registerSignalHandler(SIGINT, HandleSIGTERM);

    // Reopen debug.log on SIGHUP
    registerSignalHandler(SIGHUP, HandleSIGHUP);

    // Ignore SIGPIPE, otherwise it will bring the daemon down if the client closes unexpectedly
    signal(SIGPIPE, SIG_IGN);
#else
    SetConsoleCtrlHandler(consoleCtrlHandler, true);
#endif

    std::set_new_handler(new_handler_terminate);

    return true;
}